

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

int __thiscall
slang::SmallVectorBase<slang::parsing::Trivia>::copy
          (SmallVectorBase<slang::parsing::Trivia> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  Trivia *__ofirst;
  
  if (this->len == 0) {
    __ofirst = (Trivia *)0x0;
  }
  else {
    __ofirst = (Trivia *)BumpAllocator::allocate((BumpAllocator *)dst,this->len << 4,4);
    std::ranges::__uninitialized_copy_fn::
    operator()<const_slang::parsing::Trivia_*,_const_slang::parsing::Trivia_*,_slang::parsing::Trivia_*,_slang::parsing::Trivia_*>
              ((__uninitialized_copy_fn *)&std::ranges::uninitialized_copy,this->data_,
               this->data_ + this->len,__ofirst,__ofirst + this->len);
  }
  return (int)__ofirst;
}

Assistant:

[[nodiscard]] std::span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::ranges::uninitialized_copy(begin(), end(), dest, dest + len);

        return std::span<T>(dest, len);
    }